

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_set.cpp
# Opt level: O0

void __thiscall
SetFixture_InsertSingleIterator_Test::~SetFixture_InsertSingleIterator_Test
          (SetFixture_InsertSingleIterator_Test *this)

{
  SetFixture_InsertSingleIterator_Test *this_local;
  
  ~SetFixture_InsertSingleIterator_Test(this);
  operator_delete(this,400);
  return;
}

Assistant:

TEST_F (SetFixture, InsertSingleIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_.insert (t1, "a"s);

    iterator begin = index_.begin (db_);
    iterator end = index_.end (db_);
    EXPECT_NE (begin, end);
    std::string const & v1 = (*begin);
    EXPECT_EQ ("a", v1);
    ++begin;
    EXPECT_EQ (begin, end);
}